

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int CheckMask(int c,char *zMask,int nMasklen,int *pOfft)

{
  int local_2c;
  int i;
  int *pOfft_local;
  int nMasklen_local;
  char *zMask_local;
  int c_local;
  
  local_2c = 0;
  while( true ) {
    if (nMasklen <= local_2c) {
      return 0;
    }
    if (c == zMask[local_2c]) break;
    local_2c = local_2c + 1;
  }
  if (pOfft != (int *)0x0) {
    *pOfft = local_2c;
  }
  return 1;
}

Assistant:

static int CheckMask(int c, const char *zMask, int nMasklen, int *pOfft)
{
	int i;
	for( i = 0 ; i < nMasklen ; ++i ){
		if( c == zMask[i] ){
			if( pOfft ){
				*pOfft = i;
			}
			return TRUE;
		}
	}
	return FALSE;
}